

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void move_sel_forward_back_proc
               (Am_Object *inter,int param_2,int param_3,Am_Object *param_4,Am_Input_Char ic)

{
  bool bVar1;
  Am_Which_Sel_Direction dir_00;
  bool local_61;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object widget;
  Am_Which_Sel_Direction dir;
  bool extend;
  Am_Object *param_3_local;
  int param_2_local;
  int param_1_local;
  Am_Object *inter_local;
  Am_Input_Char ic_local;
  
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    inter_local._6_2_ = ic._2_2_;
    local_61 = true;
    if (((uint)ic & 0x10000) == 0) {
      local_61 = (bool)((byte)(inter_local._6_2_ >> 1) & 1);
    }
    widget.data._4_4_ = ic;
    dir_00 = check_sel_move_direction(inter,ic);
    Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)inter);
    Am_Object::Am_Object(&local_48,&Am_No_Object);
    do_move_forward_back(inter,&local_40,dir_00,local_61,&local_48);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_40);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, move_sel_forward_back,
                 (Am_Object inter, int /* mouse_x */, int /* mouse_y */,
                  Am_Object /* ref_obj */, Am_Input_Char ic))
{
  if (inter.Valid()) {
    bool extend = ic.shift || ic.control;
    Am_Which_Sel_Direction dir = check_sel_move_direction(inter, ic);
    Am_Object widget = inter.Get_Owner();
    do_move_forward_back(inter, widget, dir, extend, Am_No_Object);
  }
}